

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,Script *script,string_view source_filename,
                 string_view module_filename_noext,WriteBinaryOptions *options,
                 vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                 *out_module_streams,Stream *log_stream)

{
  Result RVar1;
  BinaryWriterSpec binary_writer_spec;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  BinaryWriterSpec local_98;
  
  local_b8._M_unused._M_object = &out_module_streams;
  local_b8._8_8_ = &log_stream;
  local_a0 = std::
             _Function_handler<wabt::Stream_*(wabt::string_view),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer-spec.cc:618:7)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<wabt::Stream_*(wabt::string_view),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer-spec.cc:618:7)>
             ::_M_manager;
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            (&local_98,json_stream,(WriteBinarySpecStreamFactory *)&local_b8,source_filename,
             module_filename_noext,options);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript(&local_98,script);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.module_filename_noext_._M_dataplus._M_p !=
      &local_98.module_filename_noext_.field_2) {
    operator_delete(local_98.module_filename_noext_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.source_filename_._M_dataplus._M_p != &local_98.source_filename_.field_2) {
    operator_delete(local_98.source_filename_._M_dataplus._M_p);
  }
  if (local_98.module_stream_factory_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.module_stream_factory_.super__Function_base._M_manager)
              ((_Any_data *)&local_98.module_stream_factory_,
               (_Any_data *)&local_98.module_stream_factory_,__destroy_functor);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(
    Stream* json_stream,
    Script* script,
    string_view source_filename,
    string_view module_filename_noext,
    const WriteBinaryOptions& options,
    std::vector<FilenameMemoryStreamPair>* out_module_streams,
    Stream* log_stream) {
  WriteBinarySpecStreamFactory module_stream_factory =
      [&](string_view filename) {
        out_module_streams->emplace_back(filename,
                                         MakeUnique<MemoryStream>(log_stream));
        return out_module_streams->back().stream.get();
      };

  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}